

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::getNonbasicFreeColumnSet(HEkkPrimal *this)

{
  HEkk *pHVar1;
  HighsInt iCol;
  long lVar2;
  
  if (this->num_free_col != 0) {
    pHVar1 = this->ekk_instance_;
    HSet::clear(&this->nonbasic_free_col_set);
    for (lVar2 = 0; lVar2 < this->num_tot; lVar2 = lVar2 + 1) {
      if ((((pHVar1->basis_).nonbasicFlag_.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar2] == '\x01') &&
          ((pHVar1->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar2] <= -INFINITY)) &&
         (INFINITY <=
          (pHVar1->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar2])) {
        HSet::add(&this->nonbasic_free_col_set,(HighsInt)lVar2);
      }
    }
  }
  return;
}

Assistant:

void HEkkPrimal::getNonbasicFreeColumnSet() {
  if (!num_free_col) return;
  assert(num_free_col > 0);
  const HighsSimplexInfo& info = ekk_instance_.info_;
  const SimplexBasis& basis = ekk_instance_.basis_;
  nonbasic_free_col_set.clear();
  for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
    bool nonbasic_free = basis.nonbasicFlag_[iCol] == kNonbasicFlagTrue &&
                         info.workLower_[iCol] <= -kHighsInf &&
                         info.workUpper_[iCol] >= kHighsInf;
    if (nonbasic_free) nonbasic_free_col_set.add(iCol);
  }
  //  nonbasic_free_col_set.print();
}